

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O1

void dump_regmat_statistics
               (float64 *****regl,float64 ****regr,uint32 nclass,uint32 nfeat,uint32 *veclen)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong local_80;
  
  puts("regl");
  if (nclass != 0) {
    uVar4 = 0;
    do {
      if (nfeat != 0) {
        uVar2 = 0;
        do {
          uVar3 = (ulong)veclen[uVar2];
          if (uVar3 != 0) {
            uVar1 = 0;
            do {
              printf("class: %d, stream: %d, mixture %d\n");
              local_80 = 0;
              do {
                printf("%d ",local_80);
                uVar5 = 0;
                do {
                  printf("%f ",regl[uVar4][uVar2][uVar1][local_80][uVar5]);
                  uVar5 = uVar5 + 1;
                } while (uVar3 != uVar5);
                putchar(10);
                local_80 = local_80 + 1;
              } while (local_80 != uVar3);
              uVar1 = uVar1 + 1;
            } while (uVar1 != uVar3);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != nfeat);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != nclass);
  }
  puts("regr");
  if (nclass != 0) {
    uVar4 = 0;
    do {
      if (nfeat != 0) {
        uVar2 = 0;
        do {
          uVar3 = (ulong)veclen[uVar2];
          if (uVar3 != 0) {
            local_80 = 0;
            do {
              printf("class: %d, stream: %d, mixture %d\n",uVar4 & 0xffffffff,uVar2 & 0xffffffff,
                     local_80);
              uVar1 = 0;
              do {
                printf("%f ",regr[uVar4][uVar2][local_80][uVar1]);
                uVar1 = uVar1 + 1;
              } while (uVar3 != uVar1);
              putchar(10);
              local_80 = local_80 + 1;
            } while (local_80 != uVar3);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != nfeat);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != nclass);
  }
  return;
}

Assistant:

void dump_regmat_statistics(float64 *****regl,
		       float64 ****regr,
		       uint32 nclass,
		       uint32 nfeat,
		       const uint32  *veclen)

{
  uint32  i,j,k,l,m,len;

  printf("regl\n");
  for(m=0; m <nclass ; m++){
    for(i=0; i < nfeat ;i++){
      len=veclen[i];
      for(l=0; l < len ; l++){
	printf("class: %d, stream: %d, mixture %d\n",m,i,l);
	for(j=0;j<len;j++){
	  printf("%d ", j);
	  for(k=0;k<len;k++){
	    printf("%f ",regl[m][i][l][j][k]);
	  }
	    printf("\n");
	}
	}
    }
  }
  
  printf("regr\n");
  for(m=0; m <nclass ; m++){
    for(i=0; i < nfeat ;i++){
      len=veclen[i];
      for(l=0; l < len ; l++){
	printf("class: %d, stream: %d, mixture %d\n",m,i,l);
	for(j=0;j<len;j++){
	  printf("%f ",regr[m][i][l][j]);
	}
	printf("\n");
      }
    }
  }
    
}